

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

char * CVmObjString::find_substr
                 (vm_val_t *strval,char *basestr,char *str,size_t len,char *substr,
                 CVmObjPattern *pat,int *match_idx,int *match_len)

{
  ushort uVar1;
  re_compiled_pattern *pattern;
  vm_globalvar_t *pvVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  utf8_ptr uVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  int iVar9;
  ulong local_40;
  utf8_ptr local_38;
  
  local_40 = len;
  if (substr == (char *)0x0) {
    if (pat != (CVmObjPattern *)0x0) {
      pattern = *(re_compiled_pattern **)(pat->super_CVmObject).ext_;
      pvVar2 = G_bif_tads_globals_X->last_rex_str;
      uVar4 = *(undefined4 *)&strval->field_0x4;
      aVar3 = strval->val;
      (pvVar2->val).typ = strval->typ;
      *(undefined4 *)&(pvVar2->val).field_0x4 = uVar4;
      (pvVar2->val).val = aVar3;
      CRegexSearcherSimple::clear_group_regs(G_bif_tads_globals_X->rex_searcher);
      uVar7 = CRegexSearcherSimple::search_for_pattern
                        (G_bif_tads_globals_X->rex_searcher,pattern,basestr,str,len,match_len);
      if (-1 < (int)uVar7) {
        sVar8 = utf8_ptr::s_len(str,(ulong)uVar7);
        *match_idx = (int)sVar8;
        return str + uVar7;
      }
    }
  }
  else {
    uVar1 = *(ushort *)substr;
    iVar9 = 0;
    local_38.p_ = str;
    while (uVar5.p_ = local_38.p_, uVar1 <= local_40) {
      iVar6 = bcmp(local_38.p_,substr + 2,(ulong)uVar1);
      if (iVar6 == 0) {
        *match_idx = iVar9;
        *match_len = (uint)uVar1;
        return uVar5.p_;
      }
      utf8_ptr::inc(&local_38,&local_40);
      iVar9 = iVar9 + 1;
    }
  }
  *match_idx = -1;
  *match_len = 0;
  return (char *)0x0;
}

Assistant:

const char *CVmObjString::find_substr(
    VMG_ const vm_val_t *strval,
    const char *basestr, const char *str, size_t len,
    const char *substr, CVmObjPattern *pat, int *match_idx, int *match_len)
{
    /* search for the string or pattern */
    if (substr != 0)
    {
        /* get the substring length and buffer pointer */
        size_t sublen = vmb_get_len(substr);
        substr += VMB_LEN;

        /* search for the substring */
        utf8_ptr p((char *)str);
        for (int i = 0 ; len >= sublen ; p.inc(&len), ++i)
        {
            /* check for a match */
            if (memcmp(p.getptr(), substr, sublen) == 0)
            {
                /* got it - the match length is simply the substring length */
                *match_idx = i;
                *match_len = sublen;
                return p.getptr();
            }
        }
    }
    else if (pat != 0)
    {
        /* get the compiled pattern */
        re_compiled_pattern *cpat = pat->get_pattern(vmg0_);

        /* save the last search source string */
        G_bif_tads_globals->last_rex_str->val = *strval;
        G_bif_tads_globals->rex_searcher->clear_group_regs();

        /* search for the pattern */
        int idx = G_bif_tads_globals->rex_searcher->search_for_pattern(
            cpat, basestr, str, len, match_len);

        /* if we found the match, return it */
        if (idx >= 0)
        {
            /* set the match index and length */
            *match_idx = utf8_ptr::s_len(str, idx);
            return str + idx;
        }
    }

    /* no match */
    *match_idx = -1;
    *match_len = 0;
    return 0;
}